

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::uniformfv_invalid_count(NegativeTestContext *ctx)

{
  undefined *puVar1;
  int iVar2;
  deUint64 dVar3;
  deUint32 dVar4;
  RenderContext *renderCtx;
  TestLog *this;
  MessageBuilder *this_00;
  reference pvVar5;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<float> local_3d1;
  undefined1 local_3d0 [8];
  vector<float,_std::allocator<float>_> data;
  string local_3b0;
  MessageBuilder local_390;
  int local_210;
  allocator<char> local_209;
  GLint vec4_v;
  allocator<char> local_1d1;
  string local_1d0;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  NegativeTestContext *ctx_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)ctx;
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = uniformTestVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,puVar1,&local_1d1);
  puVar1 = uniformTestFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&vec4_v,puVar1,&local_209);
  glu::makeVtxFragSources(&local_1b0,&local_1d0,(string *)&vec4_v);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&vec4_v);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  dVar3 = program.m_program.m_info.linkTimeUs;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar3,dVar4);
  dVar3 = program.m_program.m_info.linkTimeUs;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  local_210 = glu::CallLogWrapper::glGetUniformLocation((CallLogWrapper *)dVar3,dVar4,"vec4_v");
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  if (local_210 == -1) {
    this = glu::CallLogWrapper::getLog((CallLogWrapper *)program.m_program.m_info.linkTimeUs);
    tcu::TestLog::operator<<(&local_390,this,(BeginMessageToken *)&tcu::TestLog::Message);
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_390,(char (*) [46])"// ERROR: Failed to retrieve uniform location");
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_390);
    dVar3 = program.m_program.m_info.linkTimeUs;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"Failed to retrieve uniform location",
               (allocator<char> *)
               ((long)&data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    NegativeTestContext::fail((NegativeTestContext *)dVar3,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::allocator<float>::allocator(&local_3d1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_3d0,8,&local_3d1);
  std::allocator<float>::~allocator(&local_3d1);
  dVar3 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,
             "GL_INVALID_OPERATION is generated if count is greater than 1 and the indicated uniform variable is not an array variable."
             ,&local_3f9);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar3,&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  dVar3 = program.m_program.m_info.linkTimeUs;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar3,dVar4);
  dVar3 = program.m_program.m_info.linkTimeUs;
  iVar2 = local_210;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d0,0);
  glu::CallLogWrapper::glUniform1fv((CallLogWrapper *)dVar3,iVar2,2,pvVar5);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar3 = program.m_program.m_info.linkTimeUs;
  iVar2 = local_210;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d0,0);
  glu::CallLogWrapper::glUniform2fv((CallLogWrapper *)dVar3,iVar2,2,pvVar5);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar3 = program.m_program.m_info.linkTimeUs;
  iVar2 = local_210;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d0,0);
  glu::CallLogWrapper::glUniform3fv((CallLogWrapper *)dVar3,iVar2,2,pvVar5);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar3 = program.m_program.m_info.linkTimeUs;
  iVar2 = local_210;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d0,0);
  glu::CallLogWrapper::glUniform4fv((CallLogWrapper *)dVar3,iVar2,2,pvVar5);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)program.m_program.m_info.linkTimeUs,0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_3d0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return;
}

Assistant:

void uniformfv_invalid_count (NegativeTestContext& ctx)
{
	glu::ShaderProgram program(ctx.getRenderContext(), glu::makeVtxFragSources(uniformTestVertSource, uniformTestFragSource));

	ctx.glUseProgram	(program.getProgram());
	GLint vec4_v			= ctx.glGetUniformLocation(program.getProgram(), "vec4_v");	// vec4
	ctx.expectError(GL_NO_ERROR);

	if (vec4_v == -1)
	{
		ctx.getLog() << TestLog::Message << "// ERROR: Failed to retrieve uniform location" << TestLog::EndMessage;
		ctx.fail("Failed to retrieve uniform location");
	}

	std::vector<GLfloat> data(8);

	ctx.beginSection("GL_INVALID_OPERATION is generated if count is greater than 1 and the indicated uniform variable is not an array variable.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1fv(vec4_v, 2, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2fv(vec4_v, 2, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3fv(vec4_v, 2, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4fv(vec4_v, 2, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glUseProgram(0);
}